

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonvalue.cpp
# Opt level: O2

QDebug operator<<(QDebug dbg,QJsonValue *o)

{
  Type TVar1;
  long lVar2;
  _func_int **pp_Var3;
  QDebug *pQVar4;
  qint64 t;
  QJsonValue *this;
  QJsonValue *in_RDX;
  char *t_00;
  QJsonArray *a;
  long in_FS_OFFSET;
  double t_01;
  QJsonArray local_68;
  QDebug local_60;
  QJsonArray local_58;
  QDebug local_50;
  QArrayDataPointer<char16_t> local_48;
  QDebugStateSaver saver;
  
  a = &local_68;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  saver.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)o);
  TVar1 = (in_RDX->value).t;
  if ((uint)(TVar1 + 0xfffffeec) < 2) {
    *(undefined1 *)((o->value).n + 0x30) = 0;
    pQVar4 = QDebug::operator<<((QDebug *)o,"QJsonValue(bool, ");
    this = (QJsonValue *)QDebug::operator<<(pQVar4,(in_RDX->value).t == True);
  }
  else if (TVar1 == Integer) {
    *(undefined1 *)((o->value).n + 0x30) = 0;
    pQVar4 = QDebug::operator<<((QDebug *)o,"QJsonValue(double, ");
    t = QJsonValue::toInteger(in_RDX,0);
    this = (QJsonValue *)QDebug::operator<<(pQVar4,t);
  }
  else {
    if (TVar1 == String) {
      *(undefined1 *)((o->value).n + 0x30) = 0;
      pQVar4 = QDebug::operator<<((QDebug *)o,"QJsonValue(string, ");
      QJsonValue::toString((QString *)&local_48,in_RDX);
      pQVar4 = QDebug::operator<<(pQVar4,(QString *)&local_48);
      QDebug::operator<<(pQVar4,')');
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
      goto LAB_002c9a55;
    }
    if (TVar1 == Array) {
      *(undefined1 *)((o->value).n + 0x30) = 0;
      QDebug::operator<<((QDebug *)o,"QJsonValue(array, ");
      local_58.a.d.ptr = (QExplicitlySharedDataPointer<QCborContainerPrivate>)(o->value).n;
      *(int *)&(((QList<QtCbor::Element> *)((long)local_58.a.d.ptr + 0x28))->d).d =
           *(int *)&(((QList<QtCbor::Element> *)((long)local_58.a.d.ptr + 0x28))->d).d + 1;
      QJsonValue::toArray((QJsonValue *)&local_48);
      a = &local_58;
      operator<<((Stream *)&local_50,a);
      QDebug::~QDebug(&local_50);
      QJsonArray::~QJsonArray((QJsonArray *)&local_48);
    }
    else {
      if (TVar1 != Map) {
        if (TVar1 == Null) {
          t_00 = "QJsonValue(null)";
        }
        else {
          if (TVar1 != Undefined) {
            *(undefined1 *)((o->value).n + 0x30) = 0;
            pQVar4 = QDebug::operator<<((QDebug *)o,"QJsonValue(double, ");
            TVar1 = (in_RDX->value).t;
            if (TVar1 == Integer) {
              t_01 = (double)(in_RDX->value).n;
            }
            else {
              t_01 = 0.0;
              if (TVar1 == Double) {
                t_01 = (double)(in_RDX->value).n;
              }
            }
            this = (QJsonValue *)QDebug::operator<<(pQVar4,t_01);
            goto LAB_002c9a4d;
          }
          t_00 = "QJsonValue(undefined)";
        }
        QDebug::operator<<((QDebug *)o,t_00);
        goto LAB_002c9a55;
      }
      *(undefined1 *)((o->value).n + 0x30) = 0;
      QDebug::operator<<((QDebug *)o,"QJsonValue(object, ");
      local_68.a.d.ptr = (QExplicitlySharedDataPointer<QCborContainerPrivate>)(o->value).n;
      *(int *)&(((QList<QtCbor::Element> *)((long)local_68.a.d.ptr + 0x28))->d).d =
           *(int *)&(((QList<QtCbor::Element> *)((long)local_68.a.d.ptr + 0x28))->d).d + 1;
      QJsonValue::toObject((QJsonValue *)&local_48);
      operator<<((Stream *)&local_60,(QJsonObject *)&local_68);
      QDebug::~QDebug(&local_60);
      QJsonObject::~QJsonObject((QJsonObject *)&local_48);
    }
    QDebug::~QDebug((QDebug *)a);
    this = o;
  }
LAB_002c9a4d:
  QDebug::operator<<((QDebug *)this,')');
LAB_002c9a55:
  pp_Var3 = (_func_int **)(o->value).n;
  (o->value).n = 0;
  ((dbg.stream)->ts)._vptr_QTextStream = pp_Var3;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return (QDebug)dbg.stream;
}

Assistant:

QDebug operator<<(QDebug dbg, const QJsonValue &o)
{
    QDebugStateSaver saver(dbg);
    switch (o.value.type()) {
    case QCborValue::Undefined:
        dbg << "QJsonValue(undefined)";
        break;
    case QCborValue::Null:
        dbg << "QJsonValue(null)";
        break;
    case QCborValue::True:
    case QCborValue::False:
        dbg.nospace() << "QJsonValue(bool, " << o.toBool() << ')';
        break;
    case QCborValue::Integer:
        dbg.nospace() << "QJsonValue(double, " << o.toInteger() << ')';
        break;
    case QCborValue::Double:
        dbg.nospace() << "QJsonValue(double, " << o.toDouble() << ')';
        break;
    case QCborValue::String:
        dbg.nospace() << "QJsonValue(string, " << o.toString() << ')';
        break;
    case QCborValue::Array:
        dbg.nospace() << "QJsonValue(array, ";
        dbg << o.toArray();
        dbg << ')';
        break;
    case QCborValue::Map:
        dbg.nospace() << "QJsonValue(object, ";
        dbg << o.toObject();
        dbg << ')';
        break;
    default:
        Q_UNREACHABLE();
    }
    return dbg;
}